

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver_query.hpp
# Opt level: O1

void __thiscall
asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
          (basic_resolver_query<asio::ip::tcp> *this,string *host,string *service,
          flags resolve_flags)

{
  pointer pcVar1;
  
  (this->hints_).ai_canonname = (char *)0x0;
  (this->hints_).ai_next = (addrinfo *)0x0;
  *(undefined8 *)&(this->hints_).ai_addrlen = 0;
  (this->hints_).ai_addr = (sockaddr *)0x0;
  (this->hints_).ai_flags = 0;
  (this->hints_).ai_family = 0;
  (this->hints_).ai_socktype = 0;
  (this->hints_).ai_protocol = 0;
  (this->host_name_)._M_dataplus._M_p = (pointer)&(this->host_name_).field_2;
  pcVar1 = (host->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->host_name_,pcVar1,pcVar1 + host->_M_string_length);
  (this->service_name_)._M_dataplus._M_p = (pointer)&(this->service_name_).field_2;
  pcVar1 = (service->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->service_name_,pcVar1,pcVar1 + service->_M_string_length);
  (this->hints_).ai_flags = resolve_flags;
  (this->hints_).ai_family = 0;
  (this->hints_).ai_socktype = 1;
  (this->hints_).ai_protocol = 6;
  (this->hints_).ai_addrlen = 0;
  (this->hints_).ai_addr = (sockaddr *)0x0;
  (this->hints_).ai_canonname = (char *)0x0;
  (this->hints_).ai_next = (addrinfo *)0x0;
  return;
}

Assistant:

basic_resolver_query(const std::string& host, const std::string& service,
      resolver_query_base::flags resolve_flags = address_configured)
    : hints_(),
      host_name_(host),
      service_name_(service)
  {
    typename InternetProtocol::endpoint endpoint;
    hints_.ai_flags = static_cast<int>(resolve_flags);
    hints_.ai_family = ASIO_OS_DEF(AF_UNSPEC);
    hints_.ai_socktype = endpoint.protocol().type();
    hints_.ai_protocol = endpoint.protocol().protocol();
    hints_.ai_addrlen = 0;
    hints_.ai_canonname = 0;
    hints_.ai_addr = 0;
    hints_.ai_next = 0;
  }